

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int mapEndBiome(EndNoise *en,int *out,int x,int z,int w,int h)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  void *__ptr;
  long lVar6;
  long lVar7;
  int in_ECX;
  int in_EDX;
  PerlinNoise *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar8;
  uint16_t *p_elev;
  uint64_t rsq_1;
  int64_t hz;
  int64_t hx;
  uint16_t v;
  uint64_t rsq;
  int64_t rz;
  int64_t rx;
  uint16_t *hmap;
  int64_t hh;
  int64_t hw;
  int64_t j;
  int64_t i;
  short local_62;
  long lVar9;
  uint16_t *hmap_00;
  long lVar10;
  
  iVar3 = in_R8D + 0x1a;
  lVar5 = (long)iVar3;
  iVar4 = in_R9D + 0x1a;
  __ptr = malloc(lVar5 * 2 * (long)iVar4);
  for (lVar9 = 0; lVar9 < iVar4; lVar9 = lVar9 + 1) {
    for (lVar10 = 0; lVar10 < lVar5; lVar10 = lVar10 + 1) {
      lVar6 = in_EDX + lVar10 + -0xc;
      lVar7 = in_ECX + lVar9 + -0xc;
      local_62 = 0;
      if ((0x1000 < (ulong)(lVar6 * lVar6 + lVar7 * lVar7)) &&
         (dVar8 = sampleSimplex2D(in_RSI,(double)CONCAT44(in_EDX,in_ECX),
                                  (double)CONCAT44(in_R8D,in_R9D)), dVar8 < -0.8999999761581421)) {
        local_62 = (short)(((long)((float)((uint)(float)lVar6 & (uint)DAT_00140960) * 3439.0 +
                                  (float)((uint)(float)lVar7 & (uint)DAT_00140960) * 147.0) &
                           0xffffffffU) % 0xd) + 9;
        local_62 = local_62 * local_62;
      }
      *(short *)((long)__ptr + (lVar9 * lVar5 + lVar10) * 2) = local_62;
    }
  }
  for (hmap_00 = (uint16_t *)0x0; (long)hmap_00 < (long)in_R9D;
      hmap_00 = (uint16_t *)((long)hmap_00 + 1)) {
    for (lVar5 = 0; lVar5 < in_R8D; lVar5 = lVar5 + 1) {
      lVar9 = lVar5 + in_EDX;
      lVar10 = (long)hmap_00 + (long)in_ECX;
      if ((ulong)(lVar9 * lVar9 + lVar10 * lVar10) < 0x1001) {
        puVar1 = in_RSI->d + ((long)hmap_00 * (long)in_R8D + lVar5) * 4;
        puVar1[0] = '\t';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
      }
      else {
        iVar4 = (int)lVar9 * 2 + 1;
        iVar2 = (int)lVar10 * 2 + 1;
        if ((*(int *)(in_RDI + 0x140) < 0x11) || (-1 < iVar4 * iVar4 + iVar2 * iVar2)) {
          iVar4 = getEndBiome(in_R9D,(int)((ulong)lVar5 >> 0x20),hmap_00,iVar3 >> 0x1f);
          *(int *)(in_RSI->d + ((long)hmap_00 * (long)in_R8D + lVar5) * 4) = iVar4;
        }
        else {
          puVar1 = in_RSI->d + ((long)hmap_00 * (long)in_R8D + lVar5) * 4;
          puVar1[0] = '+';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
      }
    }
  }
  free(__ptr);
  return 0;
}

Assistant:

int mapEndBiome(const EndNoise *en, int *out, int x, int z, int w, int h)
{
    int64_t i, j;
    int64_t hw = w + 26;
    int64_t hh = h + 26;
    uint16_t *hmap = (uint16_t*) malloc(sizeof(*hmap) * hw * hh);

    for (j = 0; j < hh; j++)
    {
        for (i = 0; i < hw; i++)
        {
            int64_t rx = x + i - 12;
            int64_t rz = z + j - 12;
            uint64_t rsq = rx * rx + rz * rz;
            uint16_t v = 0;
            if (rsq > 4096 && sampleSimplex2D(&en->perlin, rx, rz) < -0.9f)
            {
                //v = (llabs(rx) * 3439 + llabs(rz) * 147) % 13 + 9;
                v = (unsigned int)(
                        fabsf((float)rx) * 3439.0f + fabsf((float)rz) * 147.0f
                    ) % 13 + 9;
                v *= v;
            }
            hmap[(int64_t)j*hw+i] = v;
        }
    }

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int64_t hx = (i+x);
            int64_t hz = (j+z);
            uint64_t rsq = hx * hx + hz * hz;

            if (rsq <= 4096L)
                out[j*w+i] = the_end;
            else
            {
                hx = 2*hx + 1;
                hz = 2*hz + 1;
                if (en->mc > MC_1_13)
                {   // add outer end rings
                    rsq = hx * hx + hz * hz;
                    if ((int)rsq < 0)
                    {
                        out[j*w+i] = end_barrens;
                        continue;
                    }
                }
                uint16_t *p_elev = &hmap[(hz/2-z)*hw + (hx/2-x)];
                out[j*w+i] = getEndBiome(hx, hz, p_elev, hw);
            }
        }
    }

    free(hmap);
    return 0;
}